

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O1

JSONNode __thiscall ser::OffsetTable::TableToJSON(OffsetTable *this)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  long lVar3;
  JSONNode JVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  int iVar7;
  _Base_ptr p_Var8;
  char *__end;
  long *in_RSI;
  JSONNode valueNode;
  JSONNode offsetsnode;
  JSONNode entrynode;
  JSONNode local_88;
  internalJSONNode *local_80;
  JSONNode local_78;
  _Alloc_hider local_70;
  json_string local_68;
  long *local_48;
  _Base_ptr local_40;
  JSONNode local_38;
  
  local_48 = in_RSI;
  piVar2 = internalJSONNode::newInternal('\x04');
  (this->savepoints_).super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)piVar2;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_80 = (internalJSONNode *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OffsetTable","");
  if (1 < piVar2->refcount) {
    piVar2->refcount = piVar2->refcount - 1;
    piVar2 = internalJSONNode::newInternal(piVar2);
  }
  *(internalJSONNode **)local_80 = piVar2;
  std::__cxx11::string::_M_assign((string *)&piVar2->_name);
  piVar2->_name_encoded = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  lVar3 = *local_48;
  if (local_48[1] != lVar3) {
    p_Var8 = (_Base_ptr)0x0;
    do {
      Savepoint::ToJSON((Savepoint *)&local_70,(int)p_Var8 * 0x50 + (int)lVar3);
      local_78.internal = internalJSONNode::newInternal('\x05');
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"__offsets","");
      JVar4.internal = local_78.internal;
      if (1 < (local_78.internal)->refcount) {
        (local_78.internal)->refcount = (local_78.internal)->refcount - 1;
        JVar4.internal = internalJSONNode::newInternal(local_78.internal);
      }
      local_78.internal = JVar4.internal;
      std::__cxx11::string::_M_assign((string *)&(JVar4.internal)->_name);
      (JVar4.internal)->_name_encoded = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      lVar3 = local_48[3] + (long)p_Var8 * 0x30;
      p_Var5 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
      local_40 = p_Var8;
      while (p_Var5 != (_Rb_tree_node_base *)(lVar3 + 8)) {
        piVar2 = internalJSONNode::newInternal('\x04');
        if (1 < piVar2->refcount) {
          piVar2->refcount = piVar2->refcount - 1;
          local_88.internal = piVar2;
          piVar2 = internalJSONNode::newInternal(piVar2);
        }
        local_88.internal = piVar2;
        std::__cxx11::string::_M_assign((string *)&piVar2->_name);
        piVar2->_name_encoded = true;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
        JSONNode::JSONNode(&local_38,&local_68,*(long *)(p_Var5 + 2));
        if (1 < (local_88.internal)->refcount) {
          (local_88.internal)->refcount = (local_88.internal)->refcount - 1;
          local_88.internal = internalJSONNode::newInternal(local_88.internal);
        }
        internalJSONNode::push_back(local_88.internal,&local_38);
        if (local_38.internal != (internalJSONNode *)0x0) {
          psVar1 = &(local_38.internal)->refcount;
          *psVar1 = *psVar1 - 1;
          if (*psVar1 == 0) {
            internalJSONNode::deleteInternal(local_38.internal);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
        JSONNode::JSONNode(&local_38,&local_68,(json_string *)&p_Var5[2]._M_parent);
        if (1 < (local_88.internal)->refcount) {
          (local_88.internal)->refcount = (local_88.internal)->refcount - 1;
          local_88.internal = internalJSONNode::newInternal(local_88.internal);
        }
        internalJSONNode::push_back(local_88.internal,&local_38);
        if (local_38.internal != (internalJSONNode *)0x0) {
          psVar1 = &(local_38.internal)->refcount;
          *psVar1 = *psVar1 - 1;
          if (*psVar1 == 0) {
            internalJSONNode::deleteInternal(local_38.internal);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if (1 < (local_78.internal)->refcount) {
          (local_78.internal)->refcount = (local_78.internal)->refcount - 1;
          local_78.internal = internalJSONNode::newInternal(local_78.internal);
        }
        internalJSONNode::push_back(local_78.internal,&local_88);
        if (local_88.internal != (internalJSONNode *)0x0) {
          psVar1 = &(local_88.internal)->refcount;
          *psVar1 = *psVar1 - 1;
          if (*psVar1 == 0) {
            internalJSONNode::deleteInternal(local_88.internal);
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      }
      if (((internalJSONNode *)local_70._M_p)->refcount < 2) {
        iVar7 = (int)local_40;
      }
      else {
        ((internalJSONNode *)local_70._M_p)->refcount =
             ((internalJSONNode *)local_70._M_p)->refcount - 1;
        local_70._M_p = (pointer)internalJSONNode::newInternal(local_70._M_p);
        iVar7 = (int)local_40;
      }
      internalJSONNode::push_back((internalJSONNode *)local_70._M_p,&local_78);
      piVar2 = *(internalJSONNode **)local_80;
      if (1 < piVar2->refcount) {
        piVar2->refcount = piVar2->refcount - 1;
        piVar2 = internalJSONNode::newInternal(piVar2);
      }
      *(internalJSONNode **)local_80 = piVar2;
      internalJSONNode::push_back(piVar2,(JSONNode *)&local_70);
      if (local_78.internal != (internalJSONNode *)0x0) {
        psVar1 = &(local_78.internal)->refcount;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          internalJSONNode::deleteInternal(local_78.internal);
        }
      }
      if ((internalJSONNode *)local_70._M_p != (internalJSONNode *)0x0) {
        psVar1 = (size_t *)(local_70._M_p + 0x60);
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          internalJSONNode::deleteInternal((internalJSONNode *)local_70._M_p);
        }
      }
      p_Var8 = (_Base_ptr)(ulong)(iVar7 + 1);
      lVar3 = *local_48;
      p_Var6 = (_Base_ptr)((local_48[1] - lVar3 >> 4) * -0x3333333333333333);
    } while (p_Var8 <= p_Var6 && (long)p_Var6 - (long)p_Var8 != 0);
  }
  return (JSONNode)local_80;
}

Assistant:

JSONNode OffsetTable::TableToJSON() const
{
    JSONNode node(JSON_ARRAY);
    node.set_name("OffsetTable");
    for (unsigned savepointID = 0; savepointID < savepoints_.size(); ++savepointID)
    {
        JSONNode entrynode = savepoints_[savepointID].ToJSON(savepointID);
        JSONNode offsetsnode;
        offsetsnode.set_name("__offsets");

        const OffsetTableEntry& entry = entries_[savepointID];
        for (const_iterator iter = entry.begin(); iter != entry.end(); ++iter)
        {
            JSONNode valueNode(JSON_ARRAY);
            valueNode.set_name(iter->first);
            valueNode.push_back(JSONNode("", iter->second.offset));
            valueNode.push_back(JSONNode("", iter->second.checksum));
            offsetsnode.push_back(valueNode);
        }

        entrynode.push_back(offsetsnode);

        node.push_back(entrynode);
    }

    return node;
}